

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O2

char * __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Push<UnifiedRegex::RepeatLoopCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  size_t *psVar1;
  
  psVar1 = (size_t *)ContinuousPageStack<1UL>::Push(&this->super_ContinuousPageStack<1UL>,0x20);
  *psVar1 = this->topElementSize;
  this->topElementSize = 0x20;
  return (char *)(psVar1 + 1);
}

Assistant:

inline char* ContinuousPageStackOfVariableElements<T, InitialPageCount>::Push()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    VariableElement *const element =
        new(ContinuousPageStack<InitialPageCount>::Push(VariableElement::template
        Size<ActualT>())) VariableElement(topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
    return element->Data();
}